

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::UnitTest::RecordProperty(UnitTest *this,string *key,string *value)

{
  UnitTestImpl *this_00;
  TestProperty local_58;
  
  this_00 = this->impl_;
  TestProperty::TestProperty(&local_58,key,value);
  internal::UnitTestImpl::RecordProperty(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.value_._M_dataplus._M_p != &local_58.value_.field_2) {
    operator_delete(local_58.value_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.key_._M_dataplus._M_p != &local_58.key_.field_2) {
    operator_delete(local_58.key_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void UnitTest::RecordProperty(const std::string& key,
                              const std::string& value) {
  impl_->RecordProperty(TestProperty(key, value));
}